

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O1

int __thiscall mp::TextFormatter::apr(TextFormatter *this,File *f,char *fmt,...)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  FILE *__stream;
  NLUtils *pNVar4;
  bool bVar5;
  char in_AL;
  long *plVar6;
  size_t sVar7;
  void **ppvVar8;
  undefined8 in_RCX;
  ulong uVar9;
  long *plVar10;
  uint uVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar12;
  uint uVar13;
  byte *__s;
  char *pcVar14;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auVar15 [12];
  va_list ap;
  char buf [32];
  undefined8 local_168;
  void **local_160;
  long *local_150;
  long local_148;
  long local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  long *local_130 [2];
  long local_120 [2];
  NLUtils *local_110;
  char local_108 [31];
  char local_e9;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __stream = (FILE *)f->f_;
  local_160 = &ap[0].overflow_arg_area;
  local_168 = 0x3000000018;
  uVar11 = (uint)(*fmt != '%');
  do {
    while( true ) {
      __s = (byte *)fmt + 1;
      bVar2 = *fmt;
      if (bVar2 != 9) break;
      if (this->nl_comments == false) {
        putc(10,__stream);
        return uVar11;
      }
LAB_0011013d:
      putc((int)(char)bVar2,__stream);
      fmt = (char *)__s;
    }
    if (bVar2 == 0) {
      return uVar11;
    }
    if (bVar2 != 0x25) goto LAB_0011013d;
    uVar11 = uVar11 + 1;
    fmt = (char *)((byte *)fmt + 2);
    bVar2 = *__s;
    if (bVar2 < 0x67) {
      if (bVar2 == 0x2e) {
        do {
          pbVar12 = (byte *)fmt + 1;
          bVar2 = *fmt;
          fmt = (char *)pbVar12;
        } while (bVar2 != 0x67);
LAB_00110192:
        uVar9 = (ulong)local_168._4_4_;
        if (uVar9 < 0xa1) {
          local_168 = CONCAT44(local_168._4_4_ + 0x10,(int)local_168);
          ppvVar8 = (void **)((long)local_e8 + uVar9);
        }
        else {
          ppvVar8 = local_160;
          local_160 = local_160 + 1;
        }
        if (this->output_prec < 1) {
          auVar15 = std::to_chars(local_108,&local_e9,(double)*ppvVar8);
        }
        else {
          auVar15 = std::to_chars(local_108,&local_e9,(double)*ppvVar8,general,this->output_prec);
        }
        if (auVar15._8_4_ == 0) {
          *auVar15._0_8_ = 0;
        }
        else {
          pNVar4 = this->utils_;
          plVar6 = (long *)std::_V2::generic_category();
          (**(code **)(*plVar6 + 0x20))(local_130,plVar6,auVar15._8_4_);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x11f5b8);
          local_150 = &local_140;
          plVar10 = plVar6 + 2;
          if ((long *)*plVar6 == plVar10) {
            local_140 = *plVar10;
            uStack_138 = (undefined4)plVar6[3];
            uStack_134 = *(undefined4 *)((long)plVar6 + 0x1c);
          }
          else {
            local_140 = *plVar10;
            local_150 = (long *)*plVar6;
          }
          local_148 = plVar6[1];
          *plVar6 = (long)plVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          (*pNVar4->_vptr_NLUtils[7])(pNVar4,&local_150);
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_130[0] != local_120) {
            operator_delete(local_130[0],local_120[0] + 1);
          }
        }
        pcVar14 = local_108;
        fmt = (char *)pbVar12;
LAB_001102ea:
        cVar3 = *pcVar14;
        while (cVar3 != '\0') {
          pcVar14 = pcVar14 + 1;
          putc((int)cVar3,__stream);
          cVar3 = *pcVar14;
        }
      }
      else if (bVar2 == 99) {
        uVar9 = local_168 & 0xffffffff;
        if (uVar9 < 0x29) {
          local_168 = CONCAT44(local_168._4_4_,(int)local_168 + 8);
          ppvVar8 = (void **)((long)local_e8 + uVar9);
        }
        else {
          ppvVar8 = local_160;
          local_160 = local_160 + 1;
        }
        putc(*(int *)ppvVar8,__stream);
      }
      else {
        if (bVar2 == 100) goto LAB_00110320;
LAB_00110340:
        local_110 = this->utils_;
        local_130[0] = local_120;
        sVar7 = strlen((char *)__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,__s,__s + sVar7);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x11f5d1);
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_140 = *plVar10;
          uStack_138 = (undefined4)plVar6[3];
          uStack_134 = *(undefined4 *)((long)plVar6 + 0x1c);
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar10;
          local_150 = (long *)*plVar6;
        }
        local_148 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (*local_110->_vptr_NLUtils[7])(local_110,&local_150);
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
        }
      }
    }
    else {
      if (bVar2 != 0x7a) {
        if (bVar2 != 0x73) {
          pbVar12 = (byte *)fmt;
          if (bVar2 != 0x67) goto LAB_00110340;
          goto LAB_00110192;
        }
        uVar9 = local_168 & 0xffffffff;
        if (uVar9 < 0x29) {
          local_168 = CONCAT44(local_168._4_4_,(int)local_168 + 8);
          ppvVar8 = (void **)((long)local_e8 + uVar9);
        }
        else {
          ppvVar8 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar8;
        goto LAB_001102ea;
      }
LAB_00110320:
      uVar9 = local_168 & 0xffffffff;
      if (uVar9 < 0x29) {
        local_168 = CONCAT44(local_168._4_4_,(int)local_168 + 8);
        ppvVar8 = (void **)((long)local_e8 + uVar9);
      }
      else {
        ppvVar8 = local_160;
        local_160 = local_160 + 1;
      }
      uVar13 = *(uint *)ppvVar8;
      if ((int)uVar13 < 0) {
        putc(0x2d,__stream);
        uVar13 = -uVar13;
      }
      pcVar14 = local_108;
      do {
        *pcVar14 = (char)(uVar13 / 10) * -10 + (char)uVar13 + '0';
        pcVar14 = pcVar14 + 1;
        bVar5 = 9 < uVar13;
        uVar13 = uVar13 / 10;
      } while (bVar5);
      do {
        pcVar1 = pcVar14 + -1;
        pcVar14 = pcVar14 + -1;
        putc((int)*pcVar1,__stream);
      } while (local_108 < pcVar14);
    }
  } while( true );
}

Assistant:

int TextFormatter::apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  char buf[32], *s;
  double x;
  int rc;
  ssize_t i, j;
  va_list ap;

  rc = 0;

  va_start(ap, fmt);
  if (*fmt != '%')
    rc++;
  for(;;) {
    for(;;) {
      switch(i = *fmt++) {
      case 0:	  goto done;
      case '%': break;
      case '\t':
        if (!nl_comments) {
          putc('\n', fd);
          va_end(ap);
          return rc;
        }
        /* no break */
      default:
        putc(i, fd);
        continue;
      }
      break;
    }
    rc++;
    switch(*fmt++) {
    case 'c':
      i = va_arg(ap, int);
      putc(i, fd);
      continue;
    case 'z':
      i = va_arg(ap, size_t);
      goto have_i;
    case 'd':
      i = va_arg(ap, int);
have_i:
      if (i < 0) {
        putc('-',fd);
        i = -i;
      }
      s = buf;
      do {
        j = i / 10;
        *s++ = i - 10*j + '0';
      }
      while((i = j));
      do {
        i = *--s;
        putc(i,fd);
      }	while (s > buf);
      continue;
    case '.':
      while (*fmt++ != 'g');
    case 'g':
      x = va_arg(ap, double);
#ifndef NLW2_LIB_DMGAY_DTOA
#ifndef NL_LIB_USE_OWN_GFMT
      std::to_chars_result res;
      if (output_prec <= 0)             // shortest representation
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x);
      else                              // 24 characters enough IEEE 754
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x,
                            std::chars_format::general,
                            output_prec);
      if (res.ec == std::errc())        // OK
        *res.ptr = '\0';
      else
        Utils().myexit("aprintf / to_chars bug: " +
                       std::make_error_code(res.ec).message());
#else  // NL_LIB_USE_OWN_GFMT
      NL_LIB_GFMT::gfmt(s = buf, sizeof(buf), x, output_prec);
#endif  // NL_LIB_USE_OWN_GFMT
#else  // NLW2_LIB_DMGAY_DTOA
      s = DAVID_GAY_GFMT::gfmt(x, output_prec);
#endif
      goto have_s;
    case 's':
      s = va_arg(ap, char*);
have_s:
      while ((i = *s++))
        putc(i,fd);
      continue;
    default:
      Utils().myexit("aprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
    }
  }
done:
  va_end(ap);
  return rc;
}